

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

bool __thiscall
Js::InterpreterStackFrame::SIMDAnyNaN(InterpreterStackFrame *this,AsmJsSIMDValue *input)

{
  bool bVar1;
  undefined1 local_18 [8];
  AsmJsSIMDValue compResult;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 8) == 0) {
    return false;
  }
  _local_18 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
              SIMDFloat32x4Operation::OpEqual(input,input);
  bVar1 = SIMDBool32x4Operation::OpAllTrue<int>((SIMDValue *)local_18);
  return !bVar1;
}

Assistant:

FunctionBody * GetFunctionBody() const { return m_functionBody; }